

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

string * __thiscall
pybind11::detail::error_fetch_and_normalize::format_value_and_trace_abi_cxx11_
          (string *__return_storage_ptr__,error_fetch_and_normalize *this)

{
  Py_ssize_t PVar1;
  bool bVar2;
  int iVar3;
  PyObject *pPVar4;
  _object *p_Var5;
  PyObject **ppPVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  PyCodeObject *local_1a8;
  PyFrameObject *b_frame;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  handle local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  int local_12c;
  PyObject *pPStack_128;
  int lineno;
  PyCodeObject *f_code;
  PyFrameObject *frame;
  PyTracebackObject *tb;
  string local_108 [6];
  bool have_trace;
  string local_e8 [32];
  ulong local_c8;
  Py_ssize_t length;
  char *buffer;
  handle local_98;
  handle local_90;
  object value_bytes;
  char *message_unavailable_exc;
  handle local_58;
  object value_str;
  undefined1 local_40 [8];
  string message_error_string;
  error_fetch_and_normalize *this_local;
  string *result;
  
  message_error_string.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_40);
  bVar2 = pybind11::handle::operator_cast_to_bool(&(this->m_value).super_handle);
  if (bVar2) {
    pPVar4 = pybind11::handle::ptr(&(this->m_value).super_handle);
    p_Var5 = (_object *)PyObject_Str(pPVar4);
    pybind11::handle::handle<_object_*,_0>((handle *)&message_unavailable_exc,p_Var5);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_58,(handle)message_unavailable_exc);
    bVar2 = pybind11::handle::operator_cast_to_bool(&local_58);
    if (bVar2) {
      ppPVar6 = pybind11::handle::ptr(&local_58);
      p_Var5 = (_object *)PyUnicode_AsEncodedString(*ppPVar6,"utf-8","backslashreplace");
      pybind11::handle::handle<_object_*,_0>(&local_98,p_Var5);
      reinterpret_steal<pybind11::object>((pybind11 *)&local_90,local_98);
      bVar2 = pybind11::handle::operator_cast_to_bool(&local_90);
      if (bVar2) {
        length = 0;
        local_c8 = 0;
        ppPVar6 = pybind11::handle::ptr(&local_90);
        iVar3 = PyBytes_AsStringAndSize(*ppPVar6,&length,&local_c8);
        PVar1 = length;
        uVar7 = local_c8;
        if (iVar3 == -1) {
          detail::error_string_abi_cxx11_();
          std::__cxx11::string::operator=((string *)local_40,local_e8);
          std::__cxx11::string::~string(local_e8);
          std::__cxx11::string::operator=
                    ((string *)__return_storage_ptr__,
                     "<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>");
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_108,(char *)PVar1,uVar7,(allocator *)((long)&tb + 7));
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_108);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator((allocator<char> *)((long)&tb + 7));
        }
      }
      else {
        detail::error_string_abi_cxx11_();
        std::__cxx11::string::operator=((string *)local_40,(string *)&buffer);
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,"<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>"
                  );
      }
      object::~object((object *)&local_90);
    }
    else {
      detail::error_string_abi_cxx11_();
      std::__cxx11::string::operator=((string *)local_40,(string *)&value_bytes);
      std::__cxx11::string::~string((string *)&value_bytes);
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>");
    }
    object::~object((object *)&local_58);
  }
  else {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"<MESSAGE UNAVAILABLE>");
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"<EMPTY MESSAGE>");
  }
  tb._6_1_ = 0;
  bVar2 = pybind11::handle::operator_cast_to_bool(&(this->m_trace).super_handle);
  if (bVar2) {
    for (frame = (PyFrameObject *)pybind11::handle::ptr(&(this->m_trace).super_handle);
        (frame->ob_base).ob_size != 0; frame = (PyFrameObject *)(frame->ob_base).ob_size) {
    }
    f_code = (PyCodeObject *)frame->f_back;
    _Py_XINCREF((PyObject *)f_code);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\nAt:\n");
    while (f_code != (PyCodeObject *)0x0) {
      pPStack_128 = (PyObject *)PyFrame_GetCode(f_code);
      local_12c = PyFrame_GetLineNumber(f_code);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  ");
      pybind11::handle::handle<_object_*,_0>(&local_158,(_object *)pPStack_128[6].ob_type);
      pybind11::handle::cast<std::__cxx11::string>(&local_150,&local_158);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'(');
      std::__cxx11::to_string(&local_178,local_12c);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"): ");
      pybind11::handle::handle<_object_*,_0>((handle *)&b_frame,(_object *)pPStack_128[7].ob_refcnt)
      ;
      pybind11::handle::cast<std::__cxx11::string>(&local_198,(handle *)&b_frame);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
      _Py_DECREF(pPStack_128);
      local_1a8 = (PyCodeObject *)PyFrame_GetBack(f_code);
      _Py_DECREF(&f_code->ob_base);
      f_code = local_1a8;
    }
    tb._6_1_ = 1;
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    if ((tb._6_1_ & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    }
    std::operator+(&local_1c8,"\nMESSAGE UNAVAILABLE DUE TO EXCEPTION: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  message_error_string.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((message_error_string.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format_value_and_trace() const {
        std::string result;
        std::string message_error_string;
        if (m_value) {
            auto value_str = reinterpret_steal<object>(PyObject_Str(m_value.ptr()));
            constexpr const char *message_unavailable_exc
                = "<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>";
            if (!value_str) {
                message_error_string = detail::error_string();
                result = message_unavailable_exc;
            } else {
                // Not using `value_str.cast<std::string>()`, to not potentially throw a secondary
                // error_already_set that will then result in process termination (#4288).
                auto value_bytes = reinterpret_steal<object>(
                    PyUnicode_AsEncodedString(value_str.ptr(), "utf-8", "backslashreplace"));
                if (!value_bytes) {
                    message_error_string = detail::error_string();
                    result = message_unavailable_exc;
                } else {
                    char *buffer = nullptr;
                    Py_ssize_t length = 0;
                    if (PyBytes_AsStringAndSize(value_bytes.ptr(), &buffer, &length) == -1) {
                        message_error_string = detail::error_string();
                        result = message_unavailable_exc;
                    } else {
                        result = std::string(buffer, static_cast<std::size_t>(length));
                    }
                }
            }
        } else {
            result = "<MESSAGE UNAVAILABLE>";
        }
        if (result.empty()) {
            result = "<EMPTY MESSAGE>";
        }

        bool have_trace = false;
        if (m_trace) {
#if !defined(PYPY_VERSION)
            auto *tb = reinterpret_cast<PyTracebackObject *>(m_trace.ptr());

            // Get the deepest trace possible.
            while (tb->tb_next) {
                tb = tb->tb_next;
            }

            PyFrameObject *frame = tb->tb_frame;
            Py_XINCREF(frame);
            result += "\n\nAt:\n";
            while (frame) {
#    if PY_VERSION_HEX >= 0x030900B1
                PyCodeObject *f_code = PyFrame_GetCode(frame);
#    else
                PyCodeObject *f_code = frame->f_code;
                Py_INCREF(f_code);
#    endif
                int lineno = PyFrame_GetLineNumber(frame);
                result += "  ";
                result += handle(f_code->co_filename).cast<std::string>();
                result += '(';
                result += std::to_string(lineno);
                result += "): ";
                result += handle(f_code->co_name).cast<std::string>();
                result += '\n';
                Py_DECREF(f_code);
#    if PY_VERSION_HEX >= 0x030900B1
                auto *b_frame = PyFrame_GetBack(frame);
#    else
                auto *b_frame = frame->f_back;
                Py_XINCREF(b_frame);
#    endif
                Py_DECREF(frame);
                frame = b_frame;
            }

            have_trace = true;
#endif //! defined(PYPY_VERSION)
        }

        if (!message_error_string.empty()) {
            if (!have_trace) {
                result += '\n';
            }
            result += "\nMESSAGE UNAVAILABLE DUE TO EXCEPTION: " + message_error_string;
        }

        return result;
    }